

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O3

void memprof_write_lfunc(lj_wbuf *out,uint8_t aevent,GCfunc *fn,lua_State *L,cTValue *nextframe)

{
  uint uVar1;
  
  uVar1 = lj_debug_frameline(L,fn,nextframe);
  if (-1 < (int)uVar1) {
    lj_wbuf_addbyte(out,aevent | 8);
    lj_wbuf_addu64(out,(ulong)(fn->c).pc.ptr32 - 0x40);
    lj_wbuf_addu64(out,(ulong)uVar1);
    return;
  }
  lj_wbuf_addbyte(out,aevent | 4);
  return;
}

Assistant:

static void memprof_write_lfunc(struct lj_wbuf *out, uint8_t aevent,
				GCfunc *fn, struct lua_State *L,
				cTValue *nextframe)
{
  /*
  ** Line equals to zero when LuaJIT is built with the
  ** -DLUAJIT_DISABLE_DEBUGINFO flag.
  */
  const BCLine line = lj_debug_frameline(L, fn, nextframe);

  if (line < 0) {
    /*
    ** Line is >= 0 if we are inside a Lua function.
    ** There are cases when the memory profiler attempts
    ** to attribute allocations triggered by JIT engine recording
    ** phase with a Lua function to be recorded. It this case,
    ** lj_debug_frameline() may return BC_NOPOS (i.e. a negative value).
    ** We report such allocations as internal in order not to confuse users.
    */
    lj_wbuf_addbyte(out, aevent | ASOURCE_INT);
  } else {
    /*
    ** As a prototype is a source of an allocation, it has
    ** already been inserted into the symtab: on the start
    ** of the profiling or right after its creation.
    */
    lj_wbuf_addbyte(out, aevent | ASOURCE_LFUNC);
    lj_wbuf_addu64(out, (uintptr_t)funcproto(fn));
    lj_wbuf_addu64(out, (uint64_t)line);
  }
}